

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FdReaderWriter.cpp
# Opt level: O1

void __thiscall
JetHead::FdReaderWriter::setSelector
          (FdReaderWriter *this,SelectorListener *listener,Selector *selector,short subEvents)

{
  if (this->mFd != -1) {
    if (this->mSelector != (Selector *)0x0) {
      Selector::removeListener(this->mSelector,this->mFd,listener);
    }
    this->mSelector = selector;
    if (selector != (Selector *)0x0) {
      Selector::addListener(selector,this->mFd,subEvents,listener,0);
      return;
    }
  }
  return;
}

Assistant:

void FdReaderWriter::setSelector(SelectorListener *listener, Selector *selector,
								 short subEvents)
{	
	TRACE_BEGIN(LOG_LVL_NOTICE);
	if ( mFd != -1 )
	{
		if ( mSelector != NULL )
			mSelector->removeListener( mFd, listener );
		mSelector = selector;
		if ( mSelector != NULL )
			mSelector->addListener( mFd, subEvents, listener );
	}
}